

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_critical_rate_simulation.cpp
# Opt level: O0

void configure_parser(Parser *parser)

{
  Parser *pPVar1;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Parser *local_10;
  Parser *parser_local;
  
  local_10 = parser;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"s",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"seed",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "Mersenne Twister seed. Used to generate random bit-strings and simulate the noise channel."
             ,&local_91);
  cli::Parser::set_optional<unsigned_long>(parser,&local_30,&local_68,0x2a,&local_90,false);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"upn",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"update-console-n-frames",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"Update console output every n frames",&local_109);
  cli::Parser::set_optional<unsigned_long>(pPVar1,&local_b8,&local_e0,100,&local_108,false);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"nf",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"num-frames-to-test",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"Number of frames to test (find optimal rate for).",&local_181);
  cli::Parser::set_optional<unsigned_long>(pPVar1,&local_130,&local_158,1,&local_180,false);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"i",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"iter-bp",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Maximum number of belief propagation (BP) algorithm iterations.",
             &local_1f9);
  cli::Parser::set_optional<unsigned_long>(pPVar1,&local_1a8,&local_1d0,0x32,&local_1f8,false);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"me",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"max-frame-errors",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "Number of frame errors at which to quit the simulation. Specify zero for \'no condition\'."
             ,&local_271);
  cli::Parser::set_optional<unsigned_long>(pPVar1,&local_220,&local_248,0x32,&local_270,false);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"p",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"channel-parameter",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "Binary Symmetric Channel (BSC) channel parameter. I.e., probability of a bit to be flipped."
             ,&local_2e9);
  cli::Parser::set_optional<double>(pPVar1,&local_298,&local_2c0,0.02,&local_2e8,false);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"cp",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"code-path",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,
             "Path to file containing LDPC code (`.cscmat` or `.bincsc.json` format. Note: does not accept QC exponents!)"
             ,&local_361);
  cli::Parser::set_required<std::__cxx11::string>(pPVar1,&local_310,&local_338,&local_360,false);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pPVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"rp",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b0,"rate-adaption-path",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,
             "Path to file containing rate adaption for the LDPC code (`csv` format. Two columns of indices)."
             ,&local_3d9);
  cli::Parser::set_required<std::__cxx11::string>(pPVar1,&local_388,&local_3b0,&local_3d8,false);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  return;
}

Assistant:

void configure_parser(cli::Parser &parser) {
    parser.set_optional<std::size_t>(
            "s", "seed", 42,
            "Mersenne Twister seed. Used to generate random bit-strings and simulate the noise channel.");

    parser.set_optional<std::size_t>(
            "upn", "update-console-n-frames", 100,
            "Update console output every n frames");

    parser.set_optional<std::size_t>(
            "nf", "num-frames-to-test", 1,
            "Number of frames to test (find optimal rate for).");

    parser.set_optional<std::size_t>(
            "i", "iter-bp", 50,
            "Maximum number of belief propagation (BP) algorithm iterations.");

    parser.set_optional<std::size_t>(
            "me", "max-frame-errors", 50,
            "Number of frame errors at which to quit the simulation. Specify zero for 'no condition'.");

    parser.set_optional<double>(
            "p", "channel-parameter", 0.02,
            "Binary Symmetric Channel (BSC) channel parameter. I.e., probability of a bit to be flipped.");

    parser.set_required<std::string>(
            "cp", "code-path",
            "Path to file containing LDPC code (`.cscmat` or `.bincsc.json` format. Note: does not accept QC exponents!)");

    parser.set_required<std::string>(
            "rp", "rate-adaption-path",
            "Path to file containing rate adaption for the LDPC code (`csv` format. Two columns of indices).");
}